

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_locale.cpp
# Opt level: O0

bool ON_Locale::SetPeriodAsCRuntimeDecimalPoint(void)

{
  char *pcVar1;
  bool local_19;
  char *s;
  bool rc;
  
  s._7_1_ = PeriodIsCRuntimeDecimalPoint();
  if (!s._7_1_) {
    pcVar1 = setlocale(1,"C");
    local_19 = false;
    if ((pcVar1 != (char *)0x0) && (local_19 = false, *pcVar1 == 'C')) {
      local_19 = pcVar1[1] == '\0';
    }
    s._7_1_ = local_19;
    if (local_19 != false) {
      s._7_1_ = PeriodIsCRuntimeDecimalPoint();
    }
  }
  return s._7_1_;
}

Assistant:

bool ON_Locale::SetPeriodAsCRuntimeDecimalPoint()
{
  bool rc = ON_Locale::PeriodIsCRuntimeDecimalPoint();
  if (false == rc)
  {
#if defined(ON_COMPILER_MSC)
    // Microsoft's C compiler
    const int prev_type = _configthreadlocale(_DISABLE_PER_THREAD_LOCALE);

    const char* s = setlocale(LC_NUMERIC, "C");
    rc = (0 != s && 'C' == s[0] && 0 == s[1]);
    if (rc)
      rc = ON_Locale::PeriodIsCRuntimeDecimalPoint();

    if (prev_type != _DISABLE_PER_THREAD_LOCALE && prev_type >= 0)
      _configthreadlocale(prev_type);

#elif defined(ON_COMPILER_CLANG) || defined(ON_COMPILER_GNU)
    // Apple's Clang compiler
    const char* s = setlocale(LC_NUMERIC, "C");
    rc = (0 != s && 'C' == s[0] && 0 == s[1]);
    if (rc)
      rc = ON_Locale::PeriodIsCRuntimeDecimalPoint();
#else
    // another compiler
    const int prev_type = _configthreadlocale(_DISABLE_PER_THREAD_LOCALE);

    const char* s = setlocale(LC_NUMERIC, "C");
    rc = (0 != s && 'C' == s[0] && 0 == s[1]);
    if (rc)
      rc = ON_Locale::PeriodIsCRuntimeDecimalPoint();

    if (prev_type != _DISABLE_PER_THREAD_LOCALE && prev_type >= 0)
      _configthreadlocale(prev_type);
#endif
  }
  return rc;
}